

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MunitionDescriptor.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,MunitionDescriptor *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Descriptor:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tType:     ",0xc);
  EntityType::GetAsString_abi_cxx11_(&local_1c0,&(this->super_Descriptor).m_Type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tWarhead:  ",0xb);
  ENUMS::GetEnumAsStringWarheadType_abi_cxx11_(&local_1e0,(ENUMS *)(ulong)this->m_ui16Warhead,Value)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFuse:     ",0xc);
  ENUMS::GetEnumAsStringFuseType_abi_cxx11_(&local_200,(ENUMS *)(ulong)this->m_ui16Fuse,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tQuantity: ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tRate:     ",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString MunitionDescriptor::GetAsString() const
{
    KStringStream ss;

    ss << "Descriptor:"
       << "\n\tType:     " << m_Type.GetAsString()
       << "\tWarhead:  "   << GetEnumAsStringWarheadType( m_ui16Warhead )
       << "\n\tFuse:     " << GetEnumAsStringFuseType( m_ui16Fuse )
       << "\n\tQuantity: " << m_ui16Quantity
       << "\n\tRate:     " << m_ui16Rate
       << "\n";

    return ss.str();
}